

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O3

REF_STATUS
ref_inflate_rate(REF_INT nlayers,REF_DBL first_thickness,REF_DBL total_thickness,REF_DBL *rate)

{
  double __y;
  double dVar1;
  double dVar2;
  double dVar3;
  double __x;
  ulong uVar4;
  int iVar5;
  double dVar6;
  
  __y = (double)nlayers;
  uVar4 = (ulong)DAT_0021f140;
  __x = 1.1;
  iVar5 = 0x65;
  do {
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0x3fd,"ref_inflate_rate","iteration count exceeded");
      return 1;
    }
    dVar1 = pow(__x,__y);
    dVar2 = 1.0 - __x;
    dVar6 = ((1.0 - dVar1) * first_thickness) / dVar2 - total_thickness;
    dVar1 = pow(__x,(double)(nlayers + -1));
    dVar3 = pow(__x,__y);
    __x = __x - dVar6 / ((((dVar1 * (double)(uVar4 ^ (ulong)__y) * dVar2 + (1.0 - dVar3)) *
                          first_thickness) / dVar2) / dVar2);
    dVar6 = dVar6 / total_thickness;
    if (dVar6 <= -dVar6) {
      dVar6 = -dVar6;
    }
  } while (1e-12 < dVar6);
  *rate = __x;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_rate(REF_INT nlayers, REF_DBL first_thickness,
                                    REF_DBL total_thickness, REF_DBL *rate) {
  REF_DBL r, H, err, dHdr;
  REF_BOOL keep_going;
  REF_INT iters;
  r = 1.1;

  iters = 0;
  keep_going = REF_TRUE;
  while (keep_going) {
    iters++;
    if (iters > 100) THROW("iteration count exceeded");

    RSS(ref_inflate_total_thickness(nlayers, first_thickness, r, &H), "total");
    err = H - total_thickness;

    RSS(ref_inflate_dthickness(nlayers, first_thickness, r, &dHdr), "total");

    /* printf(" r %e H %e err %e dHdr %e\n",r,H,err,dHdr); */

    r = r - err / dHdr;

    keep_going = (ABS(err / total_thickness) > 1.0e-12);
  }

  *rate = r;

  return REF_SUCCESS;
}